

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_SerializationToStream_Test::
TestBody(GeneratedMessageTest_SerializationToStream_Test *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  int64_t iVar6;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  string_view data_00;
  int size;
  void *data_1;
  string data;
  ArrayOutputStream array_stream;
  CodedOutputStream output_stream;
  TestAllTypes message1;
  TestAllTypes message2;
  AssertHelper local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_770;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_768;
  int local_75c;
  undefined1 local_758 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  AssertHelper local_738;
  char *local_730;
  size_t local_728;
  char local_720;
  undefined7 uStack_71f;
  undefined1 local_710 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_708;
  undefined1 local_6f0 [48];
  ArrayOutputStream *local_6c0;
  undefined2 local_6b8;
  bool local_6b6;
  bool local_6b5;
  uint8_t *local_6b0;
  int64_t local_6a8;
  TestAllTypes local_6a0;
  TestAllTypes local_360;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_6a0,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_360,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_6a0);
  sVar5 = proto2_unittest::TestAllTypes::ByteSizeLong(&local_6a0);
  local_75c = (int)sVar5;
  local_728 = 0;
  local_720 = '\0';
  local_730 = &local_720;
  std::__cxx11::string::resize((ulong)&local_730,(char)sVar5);
  io::ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)local_710,local_730,local_75c,1);
  local_6b6 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_6f0 + 0x10;
  local_6b8._0_1_ = false;
  local_6b8._1_1_ = false;
  local_6b5 = false;
  local_6f0._0_8_ = puVar1;
  local_6f0._8_8_ = puVar1;
  local_6c0 = (ArrayOutputStream *)local_710;
  local_6b0 = puVar1;
  local_6a8 = io::ArrayOutputStream::ByteCount((ArrayOutputStream *)local_710);
  bVar3 = io::ArrayOutputStream::Next
                    ((ArrayOutputStream *)local_710,(void **)local_758,(int *)&local_778);
  if (bVar3 && 0 < (int)(uint)local_778.data_) {
    puVar2 = (uint8_t *)CONCAT71(local_758._1_7_,local_758[0]);
    local_6b0 = puVar2;
    local_6f0._8_8_ = (uint8_t *)0x0;
    local_6f0._0_8_ = puVar2 + -0x10;
    if ((uint)local_778.data_ < 0x11) {
      local_6b0 = puVar1;
      local_6f0._8_8_ = puVar2;
      local_6f0._0_8_ = puVar1;
    }
    local_6f0._0_8_ = local_6f0._0_8_ + (ulong)(uint)local_778.data_;
  }
  iVar4 = (*local_6a0.super_Message.super_MessageLite._vptr_MessageLite[5])
                    (&local_6a0,local_6b0,local_6f0);
  local_6b0 = (uint8_t *)CONCAT44(extraout_var,iVar4);
  bVar3 = io::CodedOutputStream::HadError((CodedOutputStream *)local_6f0);
  local_778.data_._0_4_ = CONCAT31(local_778.data_._1_3_,!bVar3);
  local_770 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_768);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_758,(internal *)&local_778,
               (AssertionResult *)"output_stream.HadError()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x2a1,(char *)CONCAT71(local_758._1_7_,local_758[0]));
    testing::internal::AssertHelper::operator=(&local_738,(Message *)&local_768);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_758._1_7_,local_758[0]) != &local_748) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_758._1_7_,local_758[0]),local_748._M_allocated_capacity + 1)
      ;
    }
    if (local_768._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_768._M_head_impl + 8))();
    }
    if (local_770 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_770,local_770);
    }
  }
  iVar6 = io::EpsCopyOutputStream::ByteCount((EpsCopyOutputStream *)local_6f0,local_6b0);
  local_778.data_._0_4_ = (int)iVar6 - (int)local_6a8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_758,"size","output_stream.ByteCount()",&local_75c,(int *)&local_778);
  if (local_758[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_778);
    if (local_750 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_750->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x2a2,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_768,(Message *)&local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_768);
    if ((long *)CONCAT44(local_778.data_._4_4_,(uint)local_778.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_778.data_._4_4_,(uint)local_778.data_) + 8))();
    }
  }
  if (local_750 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_750,local_750);
  }
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_6f0);
  data_00._M_str = local_730;
  data_00._M_len = local_728;
  local_710[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_360,data_00);
  local_708 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_710[0]) {
    testing::Message::Message((Message *)local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_6f0,(internal *)local_710,
               (AssertionResult *)"message2.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x2a4,(char *)local_6f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_778,(Message *)local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    if ((uint8_t *)local_6f0._0_8_ != puVar1) {
      operator_delete((void *)local_6f0._0_8_,local_6f0._16_8_ + 1);
    }
    if ((long *)CONCAT71(local_758._1_7_,local_758[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_758._1_7_,local_758[0]) + 8))();
    }
    if (local_708 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_708,local_708);
    }
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_360);
  if (local_730 != &local_720) {
    operator_delete(local_730,CONCAT71(uStack_71f,local_720) + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_360);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_6a0);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, SerializationToStream) {
  UNITTEST::TestAllTypes message1, message2;
  TestUtil::SetAllFields(&message1);
  int size = message1.ByteSizeLong();
  std::string data;
  data.resize(size);
  {
    // Allow the output stream to buffer only one byte at a time.
    io::ArrayOutputStream array_stream(&data[0], size, 1);
    io::CodedOutputStream output_stream(&array_stream);
    message1.SerializeWithCachedSizes(&output_stream);
    EXPECT_FALSE(output_stream.HadError());
    EXPECT_EQ(size, output_stream.ByteCount());
  }
  EXPECT_TRUE(message2.ParseFromString(data));
  TestUtil::ExpectAllFieldsSet(message2);

}